

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange::
ObservableEvents_DataSourceInstanceStateChange(ObservableEvents_DataSourceInstanceStateChange *this)

{
  ObservableEvents_DataSourceInstanceStateChange *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__ObservableEvents_DataSourceInstanceStateChange_009c0e00;
  ::std::__cxx11::string::string((string *)&this->producer_name_);
  ::std::__cxx11::string::string((string *)&this->data_source_name_);
  this->state_ = 0;
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<4UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

ObservableEvents_DataSourceInstanceStateChange::ObservableEvents_DataSourceInstanceStateChange() = default;